

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O3

Box<Imath_2_5::Vec3<float>_> *
Imath_2_5::transform<float,float>(Box<Imath_2_5::Vec3<float>_> *box,Matrix44<float> *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Box<Imath_2_5::Vec3<float>_> *newBox;
  int i;
  long lVar8;
  float *pfVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float afStack_70 [2];
  Vec3<float> points [8];
  
  points[3].x = (box->min).x;
  points[7].x = (box->max).x;
  if (points[3].x <= points[7].x) {
    points[5].y = (box->min).y;
    points[7].y = (box->max).y;
    if (points[5].y <= points[7].y) {
      points[6].z = (box->min).z;
      points[7].z = (box->max).z;
      if (points[6].z <= points[7].z) {
        if ((points[3].x == -3.4028235e+38) && (!NAN(points[3].x))) {
          if (((points[7].x == 3.4028235e+38) &&
              ((((!NAN(points[7].x) && (points[5].y == -3.4028235e+38)) && (!NAN(points[5].y))) &&
               ((points[7].y == 3.4028235e+38 && (!NAN(points[7].y))))))) &&
             ((points[6].z == -3.4028235e+38 &&
              (((!NAN(points[6].z) && (points[7].z == 3.4028235e+38)) && (!NAN(points[7].z))))))) {
            points[5].y = -3.4028235e+38;
            points[7].y = 3.4028235e+38;
            goto LAB_00120702;
          }
        }
        fVar13 = m->x[0][3];
        fVar14 = m->x[1][3];
        fVar15 = m->x[2][3];
        if (((((fVar13 != 0.0) || (NAN(fVar13))) || (fVar14 != 0.0)) ||
            ((NAN(fVar14) || (fVar15 != 0.0)))) || (NAN(fVar15))) {
          fVar17 = m->x[3][3];
        }
        else {
          fVar17 = m->x[3][3];
          if ((fVar17 == 1.0) && (!NAN(fVar17))) {
            (newBox->min).x = 3.4028235e+38;
            (newBox->min).y = 3.4028235e+38;
            *(undefined8 *)&(newBox->min).z = 0xff7fffff7f7fffff;
            (newBox->max).y = -3.4028235e+38;
            (newBox->max).z = -3.4028235e+38;
            lVar8 = 0;
            pfVar9 = (float *)m;
            do {
              fVar13 = m->x[3][lVar8];
              (&(newBox->min).x)[lVar8] = fVar13;
              lVar10 = 0;
              fVar14 = fVar13;
              do {
                fVar16 = *(float *)((long)&(box->min).x + lVar10) * pfVar9[lVar10];
                fVar15 = pfVar9[lVar10] * *(float *)((long)&(box->max).x + lVar10);
                fVar17 = fVar16;
                if (fVar15 <= fVar16) {
                  fVar17 = fVar15;
                }
                fVar13 = fVar13 + fVar17;
                if (fVar15 <= fVar16) {
                  fVar15 = fVar16;
                }
                fVar14 = fVar14 + fVar15;
                lVar10 = lVar10 + 4;
              } while (lVar10 != 0xc);
              (&(newBox->min).x)[lVar8] = fVar13;
              (&(newBox->max).x)[lVar8] = fVar14;
              lVar8 = lVar8 + 1;
              pfVar9 = pfVar9 + 1;
            } while (lVar8 != 3);
            return newBox;
          }
        }
        points[2].x = points[3].x;
        points[1].x = points[3].x;
        points[0].x = points[3].x;
        points[6].x = points[7].x;
        points[5].x = points[7].x;
        points[4].x = points[7].x;
        points[4].y = points[5].y;
        points[1].y = points[5].y;
        points[0].y = points[5].y;
        points[6].y = points[7].y;
        points[3].y = points[7].y;
        points[2].y = points[7].y;
        points[4].z = points[6].z;
        points[2].z = points[6].z;
        points[0].z = points[6].z;
        points[5].z = points[7].z;
        points[3].z = points[7].z;
        points[1].z = points[7].z;
        uVar4 = *(undefined8 *)(m->x[0] + 1);
        uVar5 = *(undefined8 *)(m->x[1] + 1);
        uVar6 = *(undefined8 *)(m->x[2] + 1);
        uVar7 = *(undefined8 *)(m->x[3] + 1);
        fVar16 = 3.4028235e+38;
        fVar18 = 3.4028235e+38;
        fVar19 = 3.4028235e+38;
        fVar20 = -3.4028235e+38;
        lVar8 = 8;
        auVar23 = _DAT_0015e1a0;
        do {
          fVar1 = *(float *)((long)afStack_70 + lVar8);
          fVar2 = *(float *)((long)afStack_70 + lVar8 + 4);
          fVar3 = *(float *)((long)&points[0].x + lVar8);
          fVar25 = fVar3 * fVar15 + fVar1 * fVar13 + fVar2 * fVar14 + fVar17;
          fVar24 = (fVar3 * m->x[2][0] + fVar1 * m->x[0][0] + fVar2 * m->x[1][0] + m->x[3][0]) /
                   fVar25;
          auVar21._0_4_ =
               fVar3 * (float)uVar6 + fVar1 * (float)uVar4 + fVar2 * (float)uVar5 + (float)uVar7;
          auVar21._4_4_ =
               fVar3 * (float)((ulong)uVar6 >> 0x20) +
               fVar1 * (float)((ulong)uVar4 >> 0x20) + fVar2 * (float)((ulong)uVar5 >> 0x20) +
               (float)((ulong)uVar7 >> 0x20);
          auVar21._8_4_ = fVar3 * 0.0 + fVar1 * 0.0 + fVar2 * 0.0 + 0.0;
          auVar21._12_4_ = fVar3 * 0.0 + fVar1 * 0.0 + fVar2 * 0.0 + 0.0;
          auVar22._4_4_ = fVar25;
          auVar22._0_4_ = fVar25;
          auVar22._8_4_ = fVar25;
          auVar22._12_4_ = fVar25;
          auVar22 = divps(auVar21,auVar22);
          uVar11 = -(uint)(auVar22._0_4_ < fVar18);
          uVar12 = -(uint)(auVar22._4_4_ < fVar19);
          fVar16 = (float)(~-(uint)(fVar24 < fVar16) & (uint)fVar16 |
                          (uint)fVar24 & -(uint)(fVar24 < fVar16));
          fVar18 = (float)(~uVar11 & (uint)fVar18 | (uint)auVar22._0_4_ & uVar11);
          fVar19 = (float)(~uVar12 & (uint)fVar19 | (uint)auVar22._4_4_ & uVar12);
          fVar20 = (float)(~-(uint)(fVar20 < fVar24) & (uint)fVar20 |
                          (uint)fVar24 & -(uint)(fVar20 < fVar24));
          auVar23 = maxps(auVar22,auVar23);
          lVar8 = lVar8 + 0xc;
        } while (lVar8 != 0x68);
        (newBox->min).x = fVar16;
        (newBox->min).y = fVar18;
        (newBox->min).z = fVar19;
        (newBox->max).x = fVar20;
        (newBox->max).y = (float)(int)auVar23._0_8_;
        (newBox->max).z = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
        return newBox;
      }
    }
  }
  else {
    points[5].y = (box->min).y;
    points[7].y = (box->max).y;
  }
LAB_00120702:
  (newBox->min).x = points[3].x;
  (newBox->min).y = points[5].y;
  (newBox->min).z = (box->min).z;
  (newBox->max).x = points[7].x;
  (newBox->max).y = points[7].y;
  (newBox->max).z = (box->max).z;
  return newBox;
}

Assistant:

Box< Vec3<S> >
transform (const Box< Vec3<S> > &box, const Matrix44<T> &m)
{
    //
    // Transform a 3D box by a matrix, and compute a new box that
    // tightly encloses the transformed box.
    //
    // If m is an affine transform, then we use James Arvo's fast
    // method as described in "Graphics Gems", Academic Press, 1990,
    // pp. 548-550.
    //

    //
    // A transformed empty box is still empty, and a transformed infinite box
    // is still infinite
    //

    if (box.isEmpty() || box.isInfinite())
	return box;

    //
    // If the last column of m is (0 0 0 1) then m is an affine
    // transform, and we use the fast Graphics Gems trick.
    //

    if (m[0][3] == 0 && m[1][3] == 0 && m[2][3] == 0 && m[3][3] == 1)
    {
	Box< Vec3<S> > newBox;

	for (int i = 0; i < 3; i++) 
        {
	    newBox.min[i] = newBox.max[i] = (S) m[3][i];

	    for (int j = 0; j < 3; j++) 
            {
		S a, b;

		a = (S) m[j][i] * box.min[j];
		b = (S) m[j][i] * box.max[j];

		if (a < b) 
                {
		    newBox.min[i] += a;
		    newBox.max[i] += b;
		}
		else 
                {
		    newBox.min[i] += b;
		    newBox.max[i] += a;
		}
	    }
	}

	return newBox;
    }

    //
    // M is a projection matrix.  Do things the naive way:
    // Transform the eight corners of the box, and find an
    // axis-parallel box that encloses the transformed corners.
    //

    Vec3<S> points[8];

    points[0][0] = points[1][0] = points[2][0] = points[3][0] = box.min[0];
    points[4][0] = points[5][0] = points[6][0] = points[7][0] = box.max[0];

    points[0][1] = points[1][1] = points[4][1] = points[5][1] = box.min[1];
    points[2][1] = points[3][1] = points[6][1] = points[7][1] = box.max[1];

    points[0][2] = points[2][2] = points[4][2] = points[6][2] = box.min[2];
    points[1][2] = points[3][2] = points[5][2] = points[7][2] = box.max[2];

    Box< Vec3<S> > newBox;

    for (int i = 0; i < 8; i++) 
	newBox.extendBy (points[i] * m);

    return newBox;
}